

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase80::run(TestCase80 *this)

{
  void *pvVar1;
  int *piVar2;
  Arena arena;
  int *local_38;
  int *local_30;
  Arena local_28;
  
  Arena::Arena(&local_28,0x400);
  pvVar1 = Arena::allocateBytes(&local_28,4,4,false);
  piVar2 = (int *)Arena::allocateBytes(&local_28,4,4,false);
  if (((int *)((long)pvVar1 + 4) != piVar2) && (_::Debug::minSeverity < 3)) {
    local_38 = piVar2;
    local_30 = (int *)((long)pvVar1 + 4);
    _::Debug::log<char_const(&)[36],int*,int*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x57,ERROR,"\"failed: expected \" \"(&i1 + 1) == (&i2)\", &i1 + 1, &i2",
               (char (*) [36])"failed: expected (&i1 + 1) == (&i2)",&local_30,&local_38);
  }
  Arena::~Arena(&local_28);
  return;
}

Assistant:

TEST(Arena, TrivialObject) {
  Arena arena;

  int& i1 = arena.allocate<int>();
  int& i2 = arena.allocate<int>();

  // Trivial objects should be tightly-packed.
  EXPECT_EQ(&i1 + 1, &i2);
}